

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::Parser::ValidateEnum(Parser *this,EnumDescriptorProto *proto)

{
  byte bVar1;
  bool bVar2;
  bool bVar3;
  byte bVar4;
  bool bVar5;
  int iVar6;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::UninterpretedOption>_>
  *from;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::UninterpretedOption_NamePart>_>
  *pVVar7;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumValueDescriptorProto>_>
  *pVVar8;
  undefined1 *puVar9;
  int iVar10;
  ErrorMaker error;
  ErrorMaker error_00;
  flat_hash_set<int,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
  used_values;
  int32_t local_cc;
  Parser *local_c8;
  RepeatedPtrFieldBase *local_c0;
  iterator local_b8;
  pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>::iterator,_bool>
  local_a8;
  undefined1 local_90 [96];
  
  puVar9 = (undefined1 *)(proto->field_0)._impl_.options_;
  if ((EnumOptions *)puVar9 == (EnumOptions *)0x0) {
    puVar9 = _EnumOptions_default_instance_;
  }
  local_c8 = this;
  if (*(int *)((long)&((EnumOptions *)puVar9)->field_0 + 0x28) < 1) {
    bVar2 = true;
    bVar5 = true;
  }
  else {
    bVar4 = 0;
    bVar1 = 0;
    iVar10 = 0;
    do {
      from = internal::RepeatedPtrFieldBase::
             Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::UninterpretedOption>>
                       (&(((EnumOptions *)puVar9)->field_0)._impl_.uninterpreted_option_.
                         super_RepeatedPtrFieldBase,iVar10);
      UninterpretedOption::UninterpretedOption((UninterpretedOption *)local_90,(Arena *)0x0,from);
      bVar5 = false;
      if ((int)local_90._32_4_ < 2) {
        pVVar7 = internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::UninterpretedOption_NamePart>>
                           ((RepeatedPtrFieldBase *)(local_90 + 0x18),0);
        bVar5 = false;
        if ((pVVar7->field_0)._impl_.is_extension_ == false) {
          pVVar7 = internal::RepeatedPtrFieldBase::
                   Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::UninterpretedOption_NamePart>>
                             ((RepeatedPtrFieldBase *)(local_90 + 0x18),0);
          iVar6 = std::__cxx11::string::compare
                            ((char *)((ulong)(pVVar7->field_0)._impl_.name_part_.tagged_ptr_.ptr_ &
                                     0xfffffffffffffffc));
          if (iVar6 == 0) {
            iVar6 = std::__cxx11::string::compare((char *)(local_90._48_8_ & 0xfffffffffffffffc));
            if (iVar6 == 0) {
              bVar1 = 1;
            }
            bVar4 = 1;
            bVar5 = true;
          }
        }
      }
      UninterpretedOption::~UninterpretedOption((UninterpretedOption *)local_90);
      if (bVar5) break;
      puVar9 = (undefined1 *)(proto->field_0)._impl_.options_;
      if ((EnumOptions *)puVar9 == (EnumOptions *)0x0) {
        puVar9 = _EnumOptions_default_instance_;
      }
      iVar10 = iVar10 + 1;
    } while (iVar10 < *(int *)((long)&((EnumOptions *)puVar9)->field_0 + 0x28));
    bVar5 = (bool)(bVar4 ^ 1 | bVar1);
    bVar2 = (bool)(bVar1 ^ 1);
  }
  if (bVar5) {
    local_90._0_8_ = (_func_int **)0x1;
    local_90._8_8_ = 0;
    iVar10 = 0;
    if (*(int *)((long)&proto->field_0 + 0x10) < 1) {
      bVar3 = false;
    }
    else {
      local_c0 = &(proto->field_0)._impl_.value_.super_RepeatedPtrFieldBase;
      do {
        pVVar8 = internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumValueDescriptorProto>>
                           (local_c0,iVar10);
        local_cc = (pVVar8->field_0)._impl_.number_;
        local_a8.first =
             absl::lts_20250127::container_internal::
             raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
             ::find<int>((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                          *)local_90,&local_cc);
        absl::lts_20250127::container_internal::
        raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
        ::AssertNotDebugCapacity
                  ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                    *)local_90);
        local_b8.ctrl_ = (ctrl_t *)0x0;
        bVar5 = absl::lts_20250127::container_internal::operator==(&local_a8.first,&local_b8);
        bVar3 = true;
        if (!bVar5) break;
        local_cc = (pVVar8->field_0)._impl_.number_;
        local_b8.ctrl_ = (ctrl_t *)local_90;
        absl::lts_20250127::container_internal::
        raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,absl::lts_20250127::hash_internal::Hash<int>,std::equal_to<int>,std::allocator<int>>
        ::EmplaceDecomposable::operator()(&local_a8,&local_b8,&local_cc,&local_cc);
        iVar10 = iVar10 + 1;
        bVar3 = false;
      } while (iVar10 < *(int *)((long)&proto->field_0 + 0x10));
    }
    bVar5 = (bool)(bVar2 | bVar3);
    if (!bVar2 && !bVar3) {
      error_00.func_ =
           ErrorMaker::
           ErrorMaker<google::protobuf::compiler::Parser::ValidateEnum(google::protobuf::EnumDescriptorProto_const*)::$_1,void>(google::protobuf::compiler::Parser::ValidateEnum(google::protobuf::EnumDescriptorProto_const*)::$_1)
           ::{lambda(void_const*)#1}::__invoke_abi_cxx11_;
      error_00.field_0.error_ = (char *)proto;
      RecordError(local_c8,error_00);
    }
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
    ::destructor_impl((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                       *)local_90);
  }
  else {
    error.func_ = ErrorMaker::
                  ErrorMaker<google::protobuf::compiler::Parser::ValidateEnum(google::protobuf::EnumDescriptorProto_const*)::$_0,void>(google::protobuf::compiler::Parser::ValidateEnum(google::protobuf::EnumDescriptorProto_const*)::$_0)
                  ::{lambda(void_const*)#1}::__invoke_abi_cxx11_;
    error.field_0.error_ = (char *)proto;
    RecordError(local_c8,error);
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool Parser::ValidateEnum(const EnumDescriptorProto* proto) {
  bool has_allow_alias = false;
  bool allow_alias = false;

  for (int i = 0; i < proto->options().uninterpreted_option_size(); i++) {
    const UninterpretedOption option = proto->options().uninterpreted_option(i);
    if (option.name_size() > 1) {
      continue;
    }
    if (!option.name(0).is_extension() &&
        option.name(0).name_part() == "allow_alias") {
      has_allow_alias = true;
      if (option.identifier_value() == "true") {
        allow_alias = true;
      }
      break;
    }
  }

  if (has_allow_alias && !allow_alias) {
    // This needlessly clutters declarations with nops.
    RecordError([=] {
      return absl::StrCat(
          "\"", proto->name(),
          "\" declares 'option allow_alias = false;' which has no effect. "
          "Please remove the declaration.");
    });
    return false;
  }

  absl::flat_hash_set<int> used_values;
  bool has_duplicates = false;
  for (int i = 0; i < proto->value_size(); ++i) {
    const EnumValueDescriptorProto& enum_value = proto->value(i);
    if (used_values.find(enum_value.number()) != used_values.end()) {
      has_duplicates = true;
      break;
    } else {
      used_values.insert(enum_value.number());
    }
  }
  if (allow_alias && !has_duplicates) {
    // Generate an error if an enum declares support for duplicate enum values
    // and does not use it protect future authors.
    RecordError([=] {
      return absl::StrCat(
          "\"", proto->name(),
          "\" declares support for enum aliases but no enum values share field "
          "numbers. Please remove the unnecessary 'option allow_alias = true;' "
          "declaration.");
    });
    return false;
  }

  return true;
}